

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

int __thiscall Units::setFlowFactor(Units *this,int flowUnits)

{
  int iVar1;
  double dVar2;
  size_type *local_40;
  string s;
  
  local_40 = &s._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CFS","");
  dVar2 = 1.0;
  switch(flowUnits) {
  case 0:
    iVar1 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x148345);
    dVar2 = 1.0;
    break;
  case 1:
    iVar1 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x148349);
    dVar2 = 448.831;
    break;
  case 2:
    iVar1 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x14834e);
    dVar2 = 0.64632;
    break;
  case 3:
    iVar1 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x14834d);
    dVar2 = 0.5382;
    break;
  case 4:
    iVar1 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x148352);
    dVar2 = 1.9837;
    break;
  case 5:
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x148356);
    dVar2 = 28.317;
    goto LAB_0012ae11;
  case 6:
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x14835a);
    dVar2 = 1699.0;
    goto LAB_0012ae11;
  case 7:
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x14835e);
    dVar2 = 2.4466;
    goto LAB_0012ae11;
  case 8:
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x148362);
    dVar2 = 101.94;
    goto LAB_0012ae11;
  case 9:
    std::__cxx11::string::_M_replace((ulong)&local_40,0,s._M_dataplus._M_p,0x148366);
    dVar2 = 2446.6;
LAB_0012ae11:
    iVar1 = 1;
    break;
  default:
    iVar1 = 0;
  }
  this->factors[5] = dVar2;
  std::__cxx11::string::_M_assign((string *)(this->names + 5));
  if (local_40 != &s._M_string_length) {
    operator_delete(local_40);
  }
  return iVar1;
}

Assistant:

int Units::setFlowFactor(const int flowUnits)
{
    int    unitSystem = Options::US;
    double flowFactor = 1.0;
    string s = "CFS";

    switch(flowUnits)
    {
    case Options::CFS:  flowFactor = 1.0;
                        s = "CFS";
                        break;
    case Options::GPM:  flowFactor = GPMperCFS;
                        s = "GPM";
                        break;
    case Options::MGD:  flowFactor = MGDperCFS;
                        s = "MGD";
                        break;
    case Options::IMGD: flowFactor = IMGDperCFS;
                        s = "IMGD";
                        break;
    case Options::AFD:  flowFactor = AFDperCFS;
                        s = "AFD";
                        break;

    case Options::LPS:  flowFactor = LPSperCFS;
                        s = "LPS";
                        unitSystem = Options::SI;
                        break;
    case Options::LPM:  flowFactor = LPMperCFS;
                        s = "LPM";
                        unitSystem = Options::SI;
                        break;
    case Options::MLD:  flowFactor = MLDperCFS;
                        s = "MLD";
                        unitSystem = Options::SI;
                        break;
    case Options::CMH:  flowFactor = CMHperCFS;
                        s = "CMH";
                        unitSystem = Options::SI;
                        break;
    case Options::CMD:  flowFactor = CMDperCFS;
                        s = "CMD";
                        unitSystem = Options::SI;
                        break;
    }
    factors[FLOW] = flowFactor;
    names[FLOW] = s;
    return unitSystem;
}